

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void generateColumnNames(Parse *pParse,SrcList *pTabList,ExprList *pEList)

{
  uint uVar1;
  Vdbe *pVVar2;
  sqlite3 *db;
  ExprList_item *pEVar3;
  Expr *pEVar4;
  Mem *pMVar5;
  Table *pTVar6;
  bool bVar7;
  char *pcVar8;
  long lVar9;
  uint uVar10;
  ushort uVar11;
  code *xDel;
  ulong uVar12;
  int *piVar13;
  long lVar14;
  long lVar15;
  NameContext local_68;
  
  if (pParse->explain != '\0') {
    return;
  }
  pVVar2 = pParse->pVdbe;
  if ((pVVar2 != (Vdbe *)0x0 && pParse->colNamesSet == '\0') &&
     (db = pParse->db, db->mallocFailed == '\0')) {
    pParse->colNamesSet = '\x01';
    uVar1 = db->flags;
    sqlite3VdbeSetNumCols(pVVar2,pEList->nExpr);
    if (pEList->nExpr < 1) {
      bVar7 = false;
    }
    else {
      lVar9 = 0;
      do {
        pEVar3 = pEList->a;
        pEVar4 = pEVar3[lVar9].pExpr;
        if (pEVar4 != (Expr *)0x0) {
          pcVar8 = pEVar3[lVar9].zName;
          if (pcVar8 == (char *)0x0) {
            if (pEVar4->op == 0x98) {
              if (pTabList == (SrcList *)0x0) goto LAB_0019208b;
LAB_00191ff5:
              uVar10 = (uint)pTabList->nSrc;
              if (pTabList->nSrc < 1) {
                uVar10 = 0;
              }
              else {
                uVar12 = 0;
                piVar13 = &pTabList->a[0].iCursor;
                do {
                  if (*piVar13 == pEVar4->iTable) {
                    uVar10 = (uint)uVar12;
                    break;
                  }
                  uVar12 = uVar12 + 1;
                  piVar13 = piVar13 + 0x1a;
                } while (uVar10 != uVar12);
              }
              uVar11 = pEVar4->iColumn;
              pTVar6 = pTabList->a[uVar10].pTab;
              if ((short)uVar11 < 0) {
                uVar11 = pTVar6->iPKey;
              }
              pcVar8 = "rowid";
              if (-1 < (short)uVar11) {
                pcVar8 = *(char **)((long)&pTVar6->aCol->zName + (ulong)((uint)uVar11 * 0x30));
              }
              if ((uVar1 & 0xc) == 0) goto LAB_0019208b;
              if ((uVar1 & 4) == 0) {
                if (pVVar2->db->mallocFailed == '\0') {
                  pMVar5 = pVVar2->aColName;
                  goto LAB_00191fb9;
                }
                goto LAB_001920da;
              }
              pcVar8 = sqlite3MPrintf(db,"%s.%s",pTVar6->zName);
            }
            else {
              if ((pTabList != (SrcList *)0x0) && (pEVar4->op == 0x9a)) goto LAB_00191ff5;
LAB_0019208b:
              pcVar8 = sqlite3DbStrDup(db,pEVar3[lVar9].zSpan);
            }
            if (pVVar2->db->mallocFailed != '\0') goto LAB_001920da;
            pMVar5 = pVVar2->aColName;
            xDel = sqlite3MallocSize;
          }
          else {
            if (pVVar2->db->mallocFailed != '\0') goto LAB_001920da;
            pMVar5 = pVVar2->aColName;
LAB_00191fb9:
            xDel = (_func_void_void_ptr *)0xffffffffffffffff;
          }
          sqlite3VdbeMemSetStr(pMVar5 + lVar9,pcVar8,-1,'\x01',xDel);
        }
LAB_001920da:
        lVar9 = lVar9 + 1;
      } while (lVar9 < pEList->nExpr);
      bVar7 = 0 < pEList->nExpr;
    }
    pVVar2 = pParse->pVdbe;
    if (bVar7) {
      lVar15 = 0;
      lVar14 = 0;
      lVar9 = 0;
      local_68.pParse = pParse;
      local_68.pSrcList = pTabList;
      do {
        pcVar8 = columnType(&local_68,*(Expr **)((long)&pEList->a->pExpr + lVar15),(char **)0x0,
                            (char **)0x0,(char **)0x0);
        if (pVVar2->db->mallocFailed == '\0') {
          sqlite3VdbeMemSetStr
                    ((Mem *)((long)&pVVar2->aColName[pVVar2->nResColumn].db + lVar14),pcVar8,-1,
                     '\x01',(_func_void_void_ptr *)0xffffffffffffffff);
        }
        lVar9 = lVar9 + 1;
        lVar14 = lVar14 + 0x38;
        lVar15 = lVar15 + 0x20;
      } while (lVar9 < pEList->nExpr);
    }
  }
  return;
}

Assistant:

static void generateColumnNames(
  Parse *pParse,      /* Parser context */
  SrcList *pTabList,  /* List of tables */
  ExprList *pEList    /* Expressions defining the result set */
){
  Vdbe *v = pParse->pVdbe;
  int i, j;
  sqlite3 *db = pParse->db;
  int fullNames, shortNames;

#ifndef SQLITE_OMIT_EXPLAIN
  /* If this is an EXPLAIN, skip this step */
  if( pParse->explain ){
    return;
  }
#endif

  if( pParse->colNamesSet || NEVER(v==0) || db->mallocFailed ) return;
  pParse->colNamesSet = 1;
  fullNames = (db->flags & SQLITE_FullColNames)!=0;
  shortNames = (db->flags & SQLITE_ShortColNames)!=0;
  sqlite3VdbeSetNumCols(v, pEList->nExpr);
  for(i=0; i<pEList->nExpr; i++){
    Expr *p;
    p = pEList->a[i].pExpr;
    if( NEVER(p==0) ) continue;
    if( pEList->a[i].zName ){
      char *zName = pEList->a[i].zName;
      sqlite3VdbeSetColName(v, i, COLNAME_NAME, zName, SQLITE_TRANSIENT);
    }else if( (p->op==TK_COLUMN || p->op==TK_AGG_COLUMN) && pTabList ){
      Table *pTab;
      char *zCol;
      int iCol = p->iColumn;
      for(j=0; ALWAYS(j<pTabList->nSrc); j++){
        if( pTabList->a[j].iCursor==p->iTable ) break;
      }
      assert( j<pTabList->nSrc );
      pTab = pTabList->a[j].pTab;
      if( iCol<0 ) iCol = pTab->iPKey;
      assert( iCol==-1 || (iCol>=0 && iCol<pTab->nCol) );
      if( iCol<0 ){
        zCol = "rowid";
      }else{
        zCol = pTab->aCol[iCol].zName;
      }
      if( !shortNames && !fullNames ){
        sqlite3VdbeSetColName(v, i, COLNAME_NAME, 
            sqlite3DbStrDup(db, pEList->a[i].zSpan), SQLITE_DYNAMIC);
      }else if( fullNames ){
        char *zName = 0;
        zName = sqlite3MPrintf(db, "%s.%s", pTab->zName, zCol);
        sqlite3VdbeSetColName(v, i, COLNAME_NAME, zName, SQLITE_DYNAMIC);
      }else{
        sqlite3VdbeSetColName(v, i, COLNAME_NAME, zCol, SQLITE_TRANSIENT);
      }
    }else{
      sqlite3VdbeSetColName(v, i, COLNAME_NAME, 
          sqlite3DbStrDup(db, pEList->a[i].zSpan), SQLITE_DYNAMIC);
    }
  }
  generateColumnTypes(pParse, pTabList, pEList);
}